

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O0

void SVRG::update_inner(svrg *s,example *ec)

{
  vw *in_RDI;
  update u;
  example *in_stack_ffffffffffffffc8;
  svrg *in_stack_ffffffffffffffd0;
  
  gradient_scalar(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0.0);
  predict_stable((svrg *)in_RDI,in_stack_ffffffffffffffc8);
  gradient_scalar((svrg *)in_RDI,in_stack_ffffffffffffffc8,0.0);
  GD::foreach_feature<SVRG::update,_&SVRG::update_inner_feature>
            (in_RDI,in_stack_ffffffffffffffc8,(update *)0x2e3d27);
  return;
}

Assistant:

void update_inner(const svrg& s, example& ec)
{
  update u;
  // |ec| already has prediction according to inner weights.
  u.g_scalar_inner = gradient_scalar(s, ec, ec.pred.scalar);
  u.g_scalar_stable = gradient_scalar(s, ec, predict_stable(s, ec));
  u.eta = s.all->eta;
  u.norm = (float)s.stable_grad_count;
  GD::foreach_feature<update, update_inner_feature>(*s.all, ec, u);
}